

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_string_utf8_index_set(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp i,sexp ch)

{
  sexp psVar1;
  ulong uVar2;
  sexp_uint_t type_id;
  ulong uVar3;
  
  if ((((ulong)str & 3) == 0) && (str->tag == 9)) {
    if (((ulong)i & 1) == 0) {
      type_id = 2;
    }
    else {
      if ((char)ch == '\x1e') {
        if ((str->field_0x5 & 1) != 0) {
          psVar1 = sexp_xtype_exception(ctx,self,"string-set!: immutable string",str);
          return psVar1;
        }
        psVar1 = sexp_string_index_to_cursor(ctx,self,n,str,i);
        if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
          uVar2 = (ulong)psVar1 & 0xfffffffffffffffd;
          uVar3 = uVar2 + 7;
          if (-1 < (long)uVar2) {
            uVar3 = uVar2;
          }
          if ((str->value).uvector.length <= (long)uVar3 >> 3) {
            psVar1 = sexp_user_exception(ctx,self,"string-set!: index out of range",i);
            return psVar1;
          }
          sexp_string_utf8_set(ctx,str,psVar1,ch);
          psVar1 = (sexp)&DAT_0000043e;
        }
        return psVar1;
      }
      type_id = 4;
      i = ch;
    }
  }
  else {
    type_id = 9;
    i = str;
  }
  psVar1 = sexp_type_exception(ctx,self,type_id,i);
  return psVar1;
}

Assistant:

sexp sexp_string_utf8_index_set (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp i, sexp ch) {
  sexp off;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, i);
  sexp_assert_type(ctx, sexp_charp, SEXP_CHAR, ch);
  if (sexp_immutablep(str))
    return sexp_xtype_exception(ctx, self, "string-set!: immutable string", str);
  off = sexp_string_index_to_cursor(ctx, self, n, str, i);
  if (sexp_exceptionp(off)) return off;
  if (sexp_unbox_string_cursor(off) >= (sexp_sint_t)sexp_string_size(str))
    return sexp_user_exception(ctx, self, "string-set!: index out of range", i);
  sexp_string_utf8_set(ctx, str, off, ch);
  return SEXP_VOID;
}